

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::stencil_op(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if sfail, dpfail, or dppass is any value other than the defined symbolic constant values."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glStencilOp(&ctx->super_CallLogWrapper,0xffffffff,0,0x1e01);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glStencilOp(&ctx->super_CallLogWrapper,0x1e00,0xffffffff,0x1e01);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glStencilOp(&ctx->super_CallLogWrapper,0x1e00,0,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void stencil_op (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if sfail, dpfail, or dppass is any value other than the defined symbolic constant values.");
	ctx.glStencilOp(-1, GL_ZERO, GL_REPLACE);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glStencilOp(GL_KEEP, -1, GL_REPLACE);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glStencilOp(GL_KEEP, GL_ZERO, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}